

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimePerformInt
               (SC_Lib *pLib,Abc_Ntk_t *pNtk,int nTreeCRatio,int fUseWireLoads,int fShowAll,
               int fPrintPath,int fDumpStats)

{
  SC_Man *p_00;
  SC_Man *p;
  int fPrintPath_local;
  int fShowAll_local;
  int fUseWireLoads_local;
  int nTreeCRatio_local;
  Abc_Ntk_t *pNtk_local;
  SC_Lib *pLib_local;
  
  p_00 = Abc_SclManStart(pLib,pNtk,fUseWireLoads,1,0.0,nTreeCRatio);
  Abc_SclTimeNtkPrint(p_00,fShowAll,fPrintPath);
  if (fDumpStats != 0) {
    Abc_SclDumpStats(p_00,"stats.txt",0);
  }
  Abc_SclManFree(p_00);
  return;
}

Assistant:

void Abc_SclTimePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, int nTreeCRatio, int fUseWireLoads, int fShowAll, int fPrintPath, int fDumpStats )
{
    SC_Man * p;
    p = Abc_SclManStart( pLib, pNtk, fUseWireLoads, 1, 0, nTreeCRatio );
    Abc_SclTimeNtkPrint( p, fShowAll, fPrintPath );
    if ( fDumpStats )
        Abc_SclDumpStats( p, "stats.txt", 0 );
    Abc_SclManFree( p );
}